

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

opcode_t token2opcode(gtoken_t op)

{
  opcode_t local_c;
  gtoken_t op_local;
  
  switch(op) {
  case TOK_KEY_ISA:
    local_c = ISA;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x88,"opcode_t token2opcode(gtoken_t)");
  case TOK_OP_SHIFT_LEFT:
    local_c = LSHIFT;
    break;
  case TOK_OP_SHIFT_RIGHT:
    local_c = RSHIFT;
    break;
  case TOK_OP_MUL:
    local_c = MUL;
    break;
  case TOK_OP_DIV:
    local_c = DIV;
    break;
  case TOK_OP_REM:
    local_c = REM;
    break;
  case TOK_OP_BIT_AND:
    local_c = BAND;
    break;
  case TOK_OP_ADD:
    local_c = ADD;
    break;
  case TOK_OP_SUB:
    local_c = SUB;
    break;
  case TOK_OP_BIT_OR:
    local_c = BOR;
    break;
  case TOK_OP_BIT_XOR:
    local_c = BXOR;
    break;
  case TOK_OP_BIT_NOT:
    local_c = BNOT;
    break;
  case TOK_OP_LESS:
    local_c = LT;
    break;
  case TOK_OP_LESS_EQUAL:
    local_c = LEQ;
    break;
  case TOK_OP_GREATER:
    local_c = GT;
    break;
  case TOK_OP_GREATER_EQUAL:
    local_c = GEQ;
    break;
  case TOK_OP_ISEQUAL:
    local_c = EQ;
    break;
  case TOK_OP_ISNOTEQUAL:
    local_c = NEQ;
    break;
  case TOK_OP_ISIDENTICAL:
    local_c = EQQ;
    break;
  case TOK_OP_ISNOTIDENTICAL:
    local_c = NEQQ;
    break;
  case TOK_OP_PATTERN_MATCH:
    local_c = MATCH;
    break;
  case TOK_OP_AND:
    local_c = AND;
    break;
  case TOK_OP_OR:
    local_c = OR;
    break;
  case TOK_OP_NOT:
    local_c = NOT;
  }
  return local_c;
}

Assistant:

static opcode_t token2opcode (gtoken_t op) {
    switch (op) {
        // BIT
        case TOK_OP_SHIFT_LEFT: return LSHIFT;
        case TOK_OP_SHIFT_RIGHT: return RSHIFT;
        case TOK_OP_BIT_NOT: return BNOT;
        case TOK_OP_BIT_AND: return BAND;
        case TOK_OP_BIT_OR: return BOR;
        case TOK_OP_BIT_XOR: return BXOR;

        // MATH
        case TOK_OP_ADD: return ADD;
        case TOK_OP_SUB: return SUB;
        case TOK_OP_DIV: return DIV;
        case TOK_OP_MUL: return MUL;
        case TOK_OP_REM: return REM;
        // NEG not handled here

        // COMPARISON
        case TOK_KEY_ISA: return ISA;
        case TOK_OP_LESS: return LT;
        case TOK_OP_GREATER: return GT;
        case TOK_OP_LESS_EQUAL: return LEQ;
        case TOK_OP_GREATER_EQUAL: return GEQ;
        case TOK_OP_ISEQUAL: return EQ;
        case TOK_OP_ISNOTEQUAL: return NEQ;
        case TOK_OP_ISIDENTICAL: return EQQ;
        case TOK_OP_ISNOTIDENTICAL: return NEQQ;
        case TOK_OP_PATTERN_MATCH: return MATCH;

        // LOGICAL
        case TOK_OP_AND: return AND;
        case TOK_OP_NOT: return NOT;
        case TOK_OP_OR: return OR;

        default: assert(0); break;  // should never reach this point
    }

    // should never reach this point
    assert(0);
    return NOT;
}